

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O0

void hallucinatory_object(int *a,wchar_t *c)

{
  uint32_t uVar1;
  object_kind *poVar2;
  object_kind *kind;
  wchar_t *c_local;
  int *a_local;
  
  do {
    do {
      poVar2 = k_info;
      uVar1 = Rand_div(z_info->k_max - 1);
      poVar2 = poVar2 + (int)(uVar1 + 1);
    } while (poVar2->name == (char *)0x0);
    *a = (uint)kind_x_attr[poVar2->kidx];
    *c = kind_x_char[poVar2->kidx];
  } while ((*a == 0) || (*c == L'\0'));
  return;
}

Assistant:

static void hallucinatory_object(int *a, wchar_t *c)
{
	
	while (1) {
		/* Select a random object */
		struct object_kind *kind = &k_info[randint0(z_info->k_max - 1) + 1];

		/* Skip non-entries */
		if (!kind->name) continue;
		
		/* Retrieve attr/char (HACK - without flavors) */
		*a = kind_x_attr[kind->kidx];
		*c = kind_x_char[kind->kidx];
		
		/* HACK - Skip empty entries */
		if (*a == 0 || *c == 0) continue;

		return;
	}
}